

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O0

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<short,_float>::delay_neighbor
          (Flag_complex_edge_collapser<short,_float> *this,short u,short v,float f)

{
  reference pvVar1;
  mapped_type *pmVar2;
  short local_14;
  short local_12;
  float f_local;
  short v_local;
  short u_local;
  Flag_complex_edge_collapser<short,_float> *this_local;
  
  local_14 = v;
  local_12 = u;
  _f_local = this;
  pvVar1 = std::
           vector<boost::container::flat_map<short,_float,_std::less<short>,_void>,_std::allocator<boost::container::flat_map<short,_float,_std::less<short>,_void>_>_>
           ::operator[](&this->neighbors,(long)u);
  pmVar2 = boost::container::flat_map<short,_float,_std::less<short>,_void>::operator[]
                     (pvVar1,&local_14);
  *pmVar2 = f;
  pvVar1 = std::
           vector<boost::container::flat_map<short,_float,_std::less<short>,_void>,_std::allocator<boost::container::flat_map<short,_float,_std::less<short>,_void>_>_>
           ::operator[](&this->neighbors,(long)local_14);
  pmVar2 = boost::container::flat_map<short,_float,_std::less<short>,_void>::operator[]
                     (pvVar1,&local_12);
  *pmVar2 = f;
  return;
}

Assistant:

void delay_neighbor(Vertex u, Vertex v, Filtration_value f) {
    neighbors[u][v]=f;
    neighbors[v][u]=f;
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    neighbors_dense(u,v)=f;
    neighbors_dense(v,u)=f;
#endif
  }